

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_ml_table
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,table_type *t,
          table_format_info *fmt)

{
  basic_value<toml::type_config> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  table_format_info *ptVar3;
  char (*s) [4];
  __node_base *p_Var4;
  __node_base *p_Var5;
  anon_class_1_0_00000001 local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  table_format_info *local_58;
  string_type local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this->current_indent_ = this->current_indent_ + fmt->body_indent;
  p_Var4 = &(t->_M_h)._M_before_begin;
  local_60 = &this->keys_;
  p_Var5 = p_Var4;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__;
  local_58 = fmt;
  do {
    do {
      pbVar1 = local_68;
      p_Var5 = p_Var5->_M_nxt;
      if (p_Var5 == (__node_base *)0x0) {
        this->current_indent_ = this->current_indent_ - local_58->body_indent;
        if (local_68->_M_string_length != 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(local_68,'\n');
        }
        while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
          bVar2 = format_ml_table::anon_class_1_0_00000001::operator()
                            (&local_69,(value_type *)(p_Var4 + 5));
          if (bVar2) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_60,(value_type *)(p_Var4 + 1));
            operator()[abi_cxx11_(&local_50,this,(value_type *)(p_Var4 + 5));
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_50);
            std::__cxx11::string::~string((string *)&local_50);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60);
          }
        }
        return (string_type *)pbVar1;
      }
      v = (basic_value<toml::type_config> *)(p_Var5 + 5);
      bVar2 = format_ml_table::anon_class_1_0_00000001::operator()(&local_69,v);
    } while (bVar2);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60,(value_type *)(p_Var5 + 1));
    format_comments_abi_cxx11_
              (&local_50,this,(preserve_comments *)(p_Var5 + 0x1b),local_58->indent_type);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    format_indent_abi_cxx11_(&local_50,this,local_58->indent_type);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (v->type_ == table) {
      ptVar3 = basic_value<toml::type_config>::as_table_fmt(v);
      if (ptVar3->fmt != dotted) goto LAB_0034af11;
      operator()[abi_cxx11_(&local_50,this,v);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
LAB_0034af11:
      format_key(&local_50,this,(key_type *)(p_Var5 + 1));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<4ul>(&local_50,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)" = ",s);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      operator()[abi_cxx11_(&local_50,this,v);
      pbVar1 = local_68;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(pbVar1,'\n');
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  } while( true );
}

Assistant:

string_type format_ml_table(const table_type& t, const table_format_info& fmt) // {{{
    {
        const auto format_later = [](const value_type& v) -> bool {

            const bool is_ml_table = v.is_table() &&
                v.as_table_fmt().fmt != table_format::oneline           &&
                v.as_table_fmt().fmt != table_format::multiline_oneline &&
                v.as_table_fmt().fmt != table_format::dotted ;

            const bool is_ml_array_table = v.is_array_of_tables() &&
                v.as_array_fmt().fmt != array_format::oneline &&
                v.as_array_fmt().fmt != array_format::multiline;

            return is_ml_table || is_ml_array_table;
        };

        string_type retval;
        this->current_indent_ += fmt.body_indent;
        for(const auto& kv : t)
        {
            const auto& key = kv.first;
            const auto& val = kv.second;
            if(format_later(val))
            {
                continue;
            }
            this->keys_.push_back(key);

            retval += format_comments(val.comments(), fmt.indent_type);
            retval += format_indent(fmt.indent_type);
            if(val.is_table() && val.as_table_fmt().fmt == table_format::dotted)
            {
                retval += (*this)(val);
            }
            else
            {
                retval += format_key(key);
                retval += string_conv<string_type>(" = ");
                retval += (*this)(val);
                retval += char_type('\n');
            }
            this->keys_.pop_back();
        }
        this->current_indent_ -= fmt.body_indent;

        if( ! retval.empty())
        {
            retval += char_type('\n'); // for readability, add empty line between tables
        }
        for(const auto& kv : t)
        {
            if( ! format_later(kv.second))
            {
                continue;
            }
            // must be a [multiline.table] or [[multiline.array.of.tables]].
            // comments will be generated inside it.
            this->keys_.push_back(kv.first);
            retval += (*this)(kv.second);
            this->keys_.pop_back();
        }
        return retval;
    }